

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::EnumValueDescriptorProto::operator==
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *other)

{
  __type_conflict4 _Var1;
  bool local_19;
  EnumValueDescriptorProto *other_local;
  EnumValueDescriptorProto *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    _Var1 = ::std::operator==(&this->name_,&other->name_);
    local_19 = false;
    if (_Var1) {
      local_19 = this->number_ == other->number_;
    }
  }
  return local_19;
}

Assistant:

bool EnumValueDescriptorProto::operator==(const EnumValueDescriptorProto& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && number_ == other.number_;
}